

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

bool __thiscall
pbrt::detail::DispatchSplitCPU<6>::operator()
          (void *param_1,undefined8 param_2,undefined8 param_3,
          TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          *param_4,int param_5)

{
  int mid;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_78;
  undefined8 local_70;
  undefined8 local_68;
  DispatchSplitCPU<3> local_5a [2];
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_58;
  undefined8 local_50;
  undefined8 local_48;
  DispatchSplitCPU<3> local_39;
  undefined4 local_38;
  int local_34;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  *local_30;
  void *local_28;
  undefined8 local_18;
  undefined8 local_10;
  bool local_1;
  
  local_38 = 3;
  local_34 = param_5;
  local_30 = param_4;
  local_28 = param_1;
  local_18 = param_2;
  local_10 = param_3;
  if (param_5 + -1 < 3) {
    local_50 = param_2;
    local_48 = param_3;
    TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
    ::TaggedPointer(&local_58,param_4);
    local_1 = DispatchSplitCPU<3>::operator()(&local_39,local_50,local_48,&local_58,local_34);
  }
  else {
    local_70 = param_2;
    local_68 = param_3;
    TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
    ::TaggedPointer(&local_78,param_4);
    local_1 = DispatchSplitCPU<3>::operator()(local_5a,local_70,local_68,&local_78,local_34 + -3);
  }
  return local_1;
}

Assistant:

inline auto operator()(F func, Tp tp, int tag, TypePack<Ts...> types) {
        constexpr int mid = n / 2;

        if (tag - 1 < mid)  // 0-based indexing here to be more traditional
            return DispatchSplitCPU<mid>()(
                func, tp, tag, typename TakeFirstN<mid, TypePack<Ts...>>::type());
        else
            return DispatchSplitCPU<n - mid>()(
                func, tp, tag - mid, typename RemoveFirstN<mid, TypePack<Ts...>>::type());
    }